

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::anon_unknown_6::FindUnusedVariables::operator()
          (FindUnusedVariables *this,IdentifierExpr *node)

{
  element_type *peVar1;
  IdentifierExpr *node_local;
  FindUnusedVariables *this_local;
  
  peVar1 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&node->identifier);
  std::
  unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::emplace<std::__cxx11::string&>
            ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->all,&peVar1->val);
  peVar1 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&node->identifier);
  std::
  unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::emplace<std::__cxx11::string&>
            ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->used,&peVar1->val);
  return;
}

Assistant:

void operator()(const ast::IdentifierExpr &node) const override {
    all.emplace(node.identifier->val);
    used.emplace(node.identifier->val);
  }